

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O0

json_t * json_array(void)

{
  json_t **ppjVar1;
  json_array_t *array;
  
  array = (json_array_t *)jsonp_malloc(0x20);
  if (array == (json_array_t *)0x0) {
    array = (json_array_t *)0x0;
  }
  else {
    json_init((json_t *)array,JSON_ARRAY);
    array->entries = 0;
    array->size = 8;
    ppjVar1 = (json_t **)jsonp_malloc(array->size << 3);
    array->table = ppjVar1;
    if (array->table == (json_t **)0x0) {
      jsonp_free(array);
      array = (json_array_t *)0x0;
    }
  }
  return &array->json;
}

Assistant:

json_t *json_array(void) {
    json_array_t *array = jsonp_malloc(sizeof(json_array_t));
    if (!array)
        return NULL;
    json_init(&array->json, JSON_ARRAY);

    array->entries = 0;
    array->size = 8;

    array->table = jsonp_malloc(array->size * sizeof(json_t *));
    if (!array->table) {
        jsonp_free(array);
        return NULL;
    }

    return &array->json;
}